

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 (*pauVar22) [16];
  byte bVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  ulong *puVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  vint4 bi;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  vint4 ai;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  NodeRef stack [244];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar36._4_4_ = fVar66;
  auVar36._0_4_ = fVar66;
  auVar36._8_4_ = fVar66;
  auVar36._12_4_ = fVar66;
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar37._4_4_ = fVar67;
  auVar37._0_4_ = fVar67;
  auVar37._8_4_ = fVar67;
  auVar37._12_4_ = fVar67;
  fVar66 = fVar66 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar38._4_4_ = fVar68;
  auVar38._0_4_ = fVar68;
  auVar38._8_4_ = fVar68;
  auVar38._12_4_ = fVar68;
  fVar67 = fVar67 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar39._0_8_ = CONCAT44(fVar66,fVar66) ^ 0x8000000080000000;
  auVar39._8_4_ = -fVar66;
  auVar39._12_4_ = -fVar66;
  auVar40._0_8_ = CONCAT44(fVar67,fVar67) ^ 0x8000000080000000;
  auVar40._8_4_ = -fVar67;
  auVar40._12_4_ = -fVar67;
  auVar41._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  auVar41._8_4_ = -fVar68;
  auVar41._12_4_ = -fVar68;
  iVar24 = (tray->tnear).field_0.i[k];
  auVar42._4_4_ = iVar24;
  auVar42._0_4_ = iVar24;
  auVar42._8_4_ = iVar24;
  auVar42._12_4_ = iVar24;
  iVar24 = (tray->tfar).field_0.i[k];
  auVar43._4_4_ = iVar24;
  auVar43._0_4_ = iVar24;
  auVar43._8_4_ = iVar24;
  auVar43._12_4_ = iVar24;
  auVar45._8_4_ = 0x80000000;
  auVar45._0_8_ = 0x8000000080000000;
  auVar45._12_4_ = 0x80000000;
  auVar45._16_4_ = 0x80000000;
  auVar45._20_4_ = 0x80000000;
  auVar45._24_4_ = 0x80000000;
  auVar45._28_4_ = 0x80000000;
  puVar35 = local_7f8;
LAB_015fbd94:
  do {
    puVar28 = puVar35;
    if (puVar28 == &local_800) {
LAB_015fc26f:
      return puVar28 != &local_800;
    }
    puVar35 = puVar28 + -1;
    uVar31 = puVar28[-1];
    while ((uVar31 & 8) == 0) {
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar27),auVar39,auVar36);
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar29),auVar40,auVar37);
      auVar44 = vpmaxsd_avx(auVar44,auVar11);
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar30),auVar41,auVar38);
      auVar11 = vpmaxsd_avx(auVar11,auVar42);
      auVar44 = vpmaxsd_avx(auVar44,auVar11);
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar27 ^ 0x10)),auVar39,
                                auVar36);
      auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar29 ^ 0x10)),auVar40,
                                auVar37);
      auVar11 = vpminsd_avx(auVar11,auVar12);
      auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar30 ^ 0x10)),auVar41,
                                auVar38);
      auVar12 = vpminsd_avx(auVar12,auVar43);
      auVar11 = vpminsd_avx(auVar11,auVar12);
      auVar44 = vpcmpgtd_avx(auVar44,auVar11);
      iVar24 = vmovmskps_avx(auVar44);
      if (iVar24 == 0xf) goto LAB_015fbd94;
      bVar23 = (byte)iVar24 ^ 0xf;
      uVar25 = uVar31 & 0xfffffffffffffff0;
      lVar26 = 0;
      for (uVar31 = (ulong)bVar23; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar31 = *(ulong *)(uVar25 + lVar26 * 8);
      uVar32 = bVar23 - 1 & (uint)bVar23;
      uVar33 = (ulong)uVar32;
      if (uVar32 != 0) {
        do {
          *puVar35 = uVar31;
          puVar35 = puVar35 + 1;
          lVar26 = 0;
          for (uVar31 = uVar33; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar26 = lVar26 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar31 = *(ulong *)(uVar25 + lVar26 * 8);
        } while (uVar33 != 0);
      }
    }
    uVar25 = uVar31 & 0xfffffffffffffff0;
    for (lVar26 = 0; lVar26 != (ulong)((uint)uVar31 & 0xf) - 8; lVar26 = lVar26 + 1) {
      lVar34 = lVar26 * 0xe0;
      lVar1 = uVar25 + 0xc0 + lVar34;
      local_820 = *(undefined8 *)(lVar1 + 0x10);
      uStack_818 = *(undefined8 *)(lVar1 + 0x18);
      uStack_810 = local_820;
      uStack_808 = uStack_818;
      auVar61._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x60 + lVar34);
      auVar61._0_16_ = *(undefined1 (*) [16])(uVar25 + lVar34);
      auVar60._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x70 + lVar34);
      auVar60._0_16_ = *(undefined1 (*) [16])(uVar25 + 0x10 + lVar34);
      auVar55._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x80 + lVar34);
      auVar55._0_16_ = *(undefined1 (*) [16])(uVar25 + 0x20 + lVar34);
      auVar44 = *(undefined1 (*) [16])(uVar25 + 0x30 + lVar34);
      auVar46._16_16_ = auVar44;
      auVar46._0_16_ = auVar44;
      auVar44 = *(undefined1 (*) [16])(uVar25 + 0x40 + lVar34);
      auVar56._16_16_ = auVar44;
      auVar56._0_16_ = auVar44;
      auVar44 = *(undefined1 (*) [16])(uVar25 + 0x50 + lVar34);
      auVar54._16_16_ = auVar44;
      auVar54._0_16_ = auVar44;
      lVar1 = uVar25 + 0x90 + lVar34;
      pauVar22 = (undefined1 (*) [16])(lVar1 + 0x10);
      local_960._16_8_ = *(undefined8 *)*pauVar22;
      local_960._0_16_ = *pauVar22;
      local_960._24_8_ = *(undefined8 *)(lVar1 + 0x18);
      auVar44 = *(undefined1 (*) [16])(uVar25 + 0xa0 + lVar34);
      auVar70._16_16_ = auVar44;
      auVar70._0_16_ = auVar44;
      lVar34 = uVar25 + 0xb0 + lVar34;
      pauVar22 = (undefined1 (*) [16])(lVar34 + 0x10);
      local_980._24_8_ = *(undefined8 *)(lVar34 + 0x18);
      local_980._16_8_ = *(undefined8 *)*pauVar22;
      local_980._0_16_ = *pauVar22;
      auVar3 = vsubps_avx(auVar61,auVar46);
      auVar53 = vsubps_avx(auVar60,auVar56);
      auVar4 = vsubps_avx(auVar55,auVar54);
      auVar46 = vsubps_avx(local_960,auVar61);
      auVar5 = vsubps_avx(auVar70,auVar60);
      auVar6 = vsubps_avx(local_980,auVar55);
      auVar7._4_4_ = auVar53._4_4_ * auVar6._4_4_;
      auVar7._0_4_ = auVar53._0_4_ * auVar6._0_4_;
      auVar7._8_4_ = auVar53._8_4_ * auVar6._8_4_;
      auVar7._12_4_ = auVar53._12_4_ * auVar6._12_4_;
      auVar7._16_4_ = auVar53._16_4_ * auVar6._16_4_;
      auVar7._20_4_ = auVar53._20_4_ * auVar6._20_4_;
      auVar7._24_4_ = auVar53._24_4_ * auVar6._24_4_;
      auVar7._28_4_ = auVar53._28_4_;
      auVar13 = vfmsub231ps_fma(auVar7,auVar5,auVar4);
      auVar8._4_4_ = auVar4._4_4_ * auVar46._4_4_;
      auVar8._0_4_ = auVar4._0_4_ * auVar46._0_4_;
      auVar8._8_4_ = auVar4._8_4_ * auVar46._8_4_;
      auVar8._12_4_ = auVar4._12_4_ * auVar46._12_4_;
      auVar8._16_4_ = auVar4._16_4_ * auVar46._16_4_;
      auVar8._20_4_ = auVar4._20_4_ * auVar46._20_4_;
      auVar8._24_4_ = auVar4._24_4_ * auVar46._24_4_;
      auVar8._28_4_ = (int)((ulong)local_980._24_8_ >> 0x20);
      auVar14 = vfmsub231ps_fma(auVar8,auVar6,auVar3);
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar47._4_4_ = uVar2;
      auVar47._0_4_ = uVar2;
      auVar47._8_4_ = uVar2;
      auVar47._12_4_ = uVar2;
      auVar47._16_4_ = uVar2;
      auVar47._20_4_ = uVar2;
      auVar47._24_4_ = uVar2;
      auVar47._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar71._4_4_ = uVar2;
      auVar71._0_4_ = uVar2;
      auVar71._8_4_ = uVar2;
      auVar71._12_4_ = uVar2;
      auVar71._16_4_ = uVar2;
      auVar71._20_4_ = uVar2;
      auVar71._24_4_ = uVar2;
      auVar71._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar50._4_4_ = uVar2;
      auVar50._0_4_ = uVar2;
      auVar50._8_4_ = uVar2;
      auVar50._12_4_ = uVar2;
      auVar50._16_4_ = uVar2;
      auVar50._20_4_ = uVar2;
      auVar50._24_4_ = uVar2;
      auVar50._28_4_ = uVar2;
      fVar66 = *(float *)(ray + k * 4 + 0x80);
      auVar57._4_4_ = fVar66;
      auVar57._0_4_ = fVar66;
      auVar57._8_4_ = fVar66;
      auVar57._12_4_ = fVar66;
      auVar57._16_4_ = fVar66;
      auVar57._20_4_ = fVar66;
      auVar57._24_4_ = fVar66;
      auVar57._28_4_ = fVar66;
      auVar7 = vsubps_avx(auVar61,auVar47);
      fVar67 = *(float *)(ray + k * 4 + 0xa0);
      auVar48._4_4_ = fVar67;
      auVar48._0_4_ = fVar67;
      auVar48._8_4_ = fVar67;
      auVar48._12_4_ = fVar67;
      auVar48._16_4_ = fVar67;
      auVar48._20_4_ = fVar67;
      auVar48._24_4_ = fVar67;
      auVar48._28_4_ = fVar67;
      auVar8 = vsubps_avx(auVar60,auVar71);
      fVar68 = *(float *)(ray + k * 4 + 0xc0);
      auVar62._4_4_ = fVar68;
      auVar62._0_4_ = fVar68;
      auVar62._8_4_ = fVar68;
      auVar62._12_4_ = fVar68;
      auVar62._16_4_ = fVar68;
      auVar62._20_4_ = fVar68;
      auVar62._24_4_ = fVar68;
      auVar62._28_4_ = fVar68;
      auVar47 = vsubps_avx(auVar55,auVar50);
      auVar17._4_4_ = fVar66 * auVar8._4_4_;
      auVar17._0_4_ = fVar66 * auVar8._0_4_;
      auVar17._8_4_ = fVar66 * auVar8._8_4_;
      auVar17._12_4_ = fVar66 * auVar8._12_4_;
      auVar17._16_4_ = fVar66 * auVar8._16_4_;
      auVar17._20_4_ = fVar66 * auVar8._20_4_;
      auVar17._24_4_ = fVar66 * auVar8._24_4_;
      auVar17._28_4_ = uVar2;
      auVar44 = vfmsub231ps_fma(auVar17,auVar7,auVar48);
      auVar18._4_4_ = auVar6._4_4_ * auVar44._4_4_;
      auVar18._0_4_ = auVar6._0_4_ * auVar44._0_4_;
      auVar18._8_4_ = auVar6._8_4_ * auVar44._8_4_;
      auVar18._12_4_ = auVar6._12_4_ * auVar44._12_4_;
      auVar18._16_4_ = auVar6._16_4_ * 0.0;
      auVar18._20_4_ = auVar6._20_4_ * 0.0;
      auVar18._24_4_ = auVar6._24_4_ * 0.0;
      auVar18._28_4_ = auVar6._28_4_;
      auVar51._0_4_ = auVar44._0_4_ * auVar4._0_4_;
      auVar51._4_4_ = auVar44._4_4_ * auVar4._4_4_;
      auVar51._8_4_ = auVar44._8_4_ * auVar4._8_4_;
      auVar51._12_4_ = auVar44._12_4_ * auVar4._12_4_;
      auVar51._16_4_ = auVar4._16_4_ * 0.0;
      auVar51._20_4_ = auVar4._20_4_ * 0.0;
      auVar51._24_4_ = auVar4._24_4_ * 0.0;
      auVar51._28_4_ = 0;
      auVar4._4_4_ = fVar68 * auVar7._4_4_;
      auVar4._0_4_ = fVar68 * auVar7._0_4_;
      auVar4._8_4_ = fVar68 * auVar7._8_4_;
      auVar4._12_4_ = fVar68 * auVar7._12_4_;
      auVar4._16_4_ = fVar68 * auVar7._16_4_;
      auVar4._20_4_ = fVar68 * auVar7._20_4_;
      auVar4._24_4_ = fVar68 * auVar7._24_4_;
      auVar4._28_4_ = auVar7._28_4_;
      auVar11 = vfmsub231ps_fma(auVar4,auVar47,auVar57);
      auVar44 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar11),auVar5);
      auVar11 = vfmadd231ps_fma(auVar51,auVar53,ZEXT1632(auVar11));
      local_940 = auVar3._0_4_;
      fStack_93c = auVar3._4_4_;
      fStack_938 = auVar3._8_4_;
      fStack_934 = auVar3._12_4_;
      fStack_930 = auVar3._16_4_;
      fStack_92c = auVar3._20_4_;
      fStack_928 = auVar3._24_4_;
      auVar6._4_4_ = auVar5._4_4_ * fStack_93c;
      auVar6._0_4_ = auVar5._0_4_ * local_940;
      auVar6._8_4_ = auVar5._8_4_ * fStack_938;
      auVar6._12_4_ = auVar5._12_4_ * fStack_934;
      auVar6._16_4_ = auVar5._16_4_ * fStack_930;
      auVar6._20_4_ = auVar5._20_4_ * fStack_92c;
      auVar6._24_4_ = auVar5._24_4_ * fStack_928;
      auVar6._28_4_ = fVar67;
      auVar15 = vfmsub231ps_fma(auVar6,auVar46,auVar53);
      auVar53._4_4_ = fVar67 * auVar47._4_4_;
      auVar53._0_4_ = fVar67 * auVar47._0_4_;
      auVar53._8_4_ = fVar67 * auVar47._8_4_;
      auVar53._12_4_ = fVar67 * auVar47._12_4_;
      auVar53._16_4_ = fVar67 * auVar47._16_4_;
      auVar53._20_4_ = fVar67 * auVar47._20_4_;
      auVar53._24_4_ = fVar67 * auVar47._24_4_;
      auVar53._28_4_ = auVar5._28_4_;
      auVar16 = vfmsub231ps_fma(auVar53,auVar62,auVar8);
      auVar5._4_4_ = auVar15._4_4_ * fVar68;
      auVar5._0_4_ = auVar15._0_4_ * fVar68;
      auVar5._8_4_ = auVar15._8_4_ * fVar68;
      auVar5._12_4_ = auVar15._12_4_ * fVar68;
      auVar5._16_4_ = fVar68 * 0.0;
      auVar5._20_4_ = fVar68 * 0.0;
      auVar5._24_4_ = fVar68 * 0.0;
      auVar5._28_4_ = auVar47._28_4_;
      auVar12 = vfmadd231ps_fma(auVar5,auVar48,ZEXT1632(auVar14));
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar57,ZEXT1632(auVar13));
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),ZEXT1632(auVar16),auVar46);
      auVar53 = vandps_avx(ZEXT1632(auVar12),auVar45);
      uVar32 = auVar53._0_4_;
      auVar58._0_4_ = (float)(uVar32 ^ auVar44._0_4_);
      uVar63 = auVar53._4_4_;
      auVar58._4_4_ = (float)(uVar63 ^ auVar44._4_4_);
      uVar64 = auVar53._8_4_;
      auVar58._8_4_ = (float)(uVar64 ^ auVar44._8_4_);
      uVar65 = auVar53._12_4_;
      auVar58._12_4_ = (float)(uVar65 ^ auVar44._12_4_);
      fVar66 = auVar53._16_4_;
      auVar58._16_4_ = fVar66;
      fVar67 = auVar53._20_4_;
      auVar58._20_4_ = fVar67;
      fVar68 = auVar53._24_4_;
      auVar58._24_4_ = fVar68;
      fVar69 = auVar53._28_4_;
      auVar58._28_4_ = fVar69;
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar16),auVar3);
      auVar52._0_4_ = (float)(uVar32 ^ auVar44._0_4_);
      auVar52._4_4_ = (float)(uVar63 ^ auVar44._4_4_);
      auVar52._8_4_ = (float)(uVar64 ^ auVar44._8_4_);
      auVar52._12_4_ = (float)(uVar65 ^ auVar44._12_4_);
      auVar52._16_4_ = fVar66;
      auVar52._20_4_ = fVar67;
      auVar52._24_4_ = fVar68;
      auVar52._28_4_ = fVar69;
      auVar53 = vcmpps_avx(auVar58,ZEXT832(0) << 0x20,5);
      auVar3 = vcmpps_avx(auVar52,ZEXT832(0) << 0x20,5);
      auVar53 = vandps_avx(auVar53,auVar3);
      auVar3 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,4);
      auVar53 = vandps_avx(auVar53,auVar3);
      auVar59._0_4_ = auVar58._0_4_ + auVar52._0_4_;
      auVar59._4_4_ = auVar58._4_4_ + auVar52._4_4_;
      auVar59._8_4_ = auVar58._8_4_ + auVar52._8_4_;
      auVar59._12_4_ = auVar58._12_4_ + auVar52._12_4_;
      auVar59._16_4_ = fVar66 + fVar66;
      auVar59._20_4_ = fVar67 + fVar67;
      auVar59._24_4_ = fVar68 + fVar68;
      auVar59._28_4_ = fVar69 + fVar69;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar3._16_4_ = 0x7fffffff;
      auVar3._20_4_ = 0x7fffffff;
      auVar3._24_4_ = 0x7fffffff;
      auVar3._28_4_ = 0x7fffffff;
      auVar3 = vandps_avx(ZEXT1632(auVar12),auVar3);
      auVar4 = vcmpps_avx(auVar59,auVar3,2);
      auVar5 = auVar4 & auVar53;
      if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar5 >> 0x7f,0) != '\0') ||
            (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar5 >> 0xbf,0) != '\0') ||
          (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar5[0x1f] < '\0')
      {
        auVar53 = vandps_avx(auVar53,auVar4);
        auVar44 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
        auVar19._4_4_ = auVar15._4_4_ * auVar47._4_4_;
        auVar19._0_4_ = auVar15._0_4_ * auVar47._0_4_;
        auVar19._8_4_ = auVar15._8_4_ * auVar47._8_4_;
        auVar19._12_4_ = auVar15._12_4_ * auVar47._12_4_;
        auVar19._16_4_ = auVar47._16_4_ * 0.0;
        auVar19._20_4_ = auVar47._20_4_ * 0.0;
        auVar19._24_4_ = auVar47._24_4_ * 0.0;
        auVar19._28_4_ = auVar46._28_4_;
        auVar11 = vfmadd132ps_fma(auVar8,auVar19,ZEXT1632(auVar14));
        auVar11 = vfmadd132ps_fma(auVar7,ZEXT1632(auVar11),ZEXT1632(auVar13));
        auVar49._0_4_ = uVar32 ^ auVar11._0_4_;
        auVar49._4_4_ = uVar63 ^ auVar11._4_4_;
        auVar49._8_4_ = uVar64 ^ auVar11._8_4_;
        auVar49._12_4_ = uVar65 ^ auVar11._12_4_;
        auVar49._16_4_ = fVar66;
        auVar49._20_4_ = fVar67;
        auVar49._24_4_ = fVar68;
        auVar49._28_4_ = fVar69;
        fVar66 = *(float *)(ray + k * 4 + 0x60);
        auVar20._4_4_ = auVar3._4_4_ * fVar66;
        auVar20._0_4_ = auVar3._0_4_ * fVar66;
        auVar20._8_4_ = auVar3._8_4_ * fVar66;
        auVar20._12_4_ = auVar3._12_4_ * fVar66;
        auVar20._16_4_ = auVar3._16_4_ * fVar66;
        auVar20._20_4_ = auVar3._20_4_ * fVar66;
        auVar20._24_4_ = auVar3._24_4_ * fVar66;
        auVar20._28_4_ = fVar66;
        auVar53 = vcmpps_avx(auVar20,auVar49,1);
        fVar66 = *(float *)(ray + k * 4 + 0x100);
        auVar21._4_4_ = auVar3._4_4_ * fVar66;
        auVar21._0_4_ = auVar3._0_4_ * fVar66;
        auVar21._8_4_ = auVar3._8_4_ * fVar66;
        auVar21._12_4_ = auVar3._12_4_ * fVar66;
        auVar21._16_4_ = auVar3._16_4_ * fVar66;
        auVar21._20_4_ = auVar3._20_4_ * fVar66;
        auVar21._24_4_ = auVar3._24_4_ * fVar66;
        auVar21._28_4_ = auVar3._28_4_;
        auVar3 = vcmpps_avx(auVar49,auVar21,2);
        auVar53 = vandps_avx(auVar53,auVar3);
        auVar11 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
        auVar44 = vpand_avx(auVar11,auVar44);
        auVar53 = vpmovzxwd_avx2(auVar44);
        auVar53 = vpslld_avx2(auVar53,0x1f);
        if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar53 >> 0x7f,0) != '\0') ||
              (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0xbf,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar53[0x1f] < '\0') {
          auVar44 = vpsllw_avx(auVar44,0xf);
          auVar44 = vpacksswb_avx(auVar44,auVar44);
          uVar33 = (ulong)(byte)(SUB161(auVar44 >> 7,0) & 1 | (SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar44 >> 0x3f,0) << 7);
          do {
            uVar9 = 0;
            for (uVar10 = uVar33; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              uVar9 = uVar9 + 1;
            }
            if ((((context->scene->geometries).items[*(uint *)((long)&local_820 + uVar9 * 4)].ptr)->
                 mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_015fc26f;
            }
            uVar33 = uVar33 ^ 1L << (uVar9 & 0x3f);
          } while (uVar33 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }